

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte right_00;
  bool bVar1;
  uchar uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  byte in_CL;
  Vector *in_RDX;
  uchar *result_data;
  uchar *rdata;
  uchar *ldata;
  ValidityMask *in_stack_ffffffffffffffb8;
  uchar fun_00;
  
  right_00 = in_CL & 1;
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  puVar3 = ConstantVector::GetData<unsigned_char>((Vector *)0xe82bd4);
  puVar4 = ConstantVector::GetData<unsigned_char>((Vector *)0xe82be3);
  puVar5 = ConstantVector::GetData<unsigned_char>((Vector *)0xe82bf2);
  bVar1 = ConstantVector::IsNull((Vector *)0xe82c01);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xe82c0f), !bVar1)) {
    uVar2 = *puVar3;
    fun_00 = *puVar4;
    ConstantVector::Validity(in_RDX);
    uVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseShiftRightOperator,unsigned_char,unsigned_char,unsigned_char>
                      ((bool)fun_00,uVar2,right_00,in_stack_ffffffffffffffb8,0xe82c76);
    *puVar5 = uVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}